

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_3aed2::readScanlineThing<Imf_3_4::InputPart>(InputPart *input,bool test)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *this;
  byte in_SIL;
  FrameBuffer *in_RDI;
  FrameBuffer *in_stack_00000040;
  Header *in_stack_00000048;
  FrameBuffer dummy;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  
  if ((in_SIL & 1) != 0) {
    Imf_3_4::InputPart::header();
    uVar3 = Imf_3_4::Header::hasType();
    if ((uVar3 & 1) != 0) {
      Imf_3_4::InputPart::header();
      Imf_3_4::Header::type_abi_cxx11_();
      bVar2 = std::operator!=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar2) {
        std::operator<<((ostream *)&std::cerr,"tiled image/part didn\'t have tiledimage type\n");
      }
    }
  }
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
            ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)0x142c2c);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x142c36);
  Imf_3_4::InputPart::header();
  doFrameBuffer((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)
                dummy._map._M_t._M_impl._0_8_,in_stack_00000048,in_stack_00000040);
  Imf_3_4::InputPart::setFrameBuffer(in_RDI);
  Imf_3_4::InputPart::header();
  piVar4 = (int *)Imf_3_4::Header::dataWindow();
  iVar1 = *piVar4;
  this = (vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)Imf_3_4::InputPart::header();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::InputPart::readPixels((int)in_RDI,iVar1);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x142cf3);
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~vector(this);
  return;
}

Assistant:

void
readScanlineThing (T& input, bool test)
{

    if (test && input.header ().hasType ())
    {
        if (input.header ().type () != SCANLINEIMAGE)
        {
            std::cerr << "tiled image/part didn't have tiledimage type\n";
            //assert(input.type()==TILEDIMAGE);
        }
    }

    vector<half> value;
    FrameBuffer  dummy;
    doFrameBuffer (value, input.header (), dummy);
    input.setFrameBuffer (dummy);
    input.readPixels (
        input.header ().dataWindow ().min.x,
        input.header ().dataWindow ().max.x);
}